

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
::local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>
           *this,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
          longdouble delta)

{
  longdouble lVar1;
  int iVar2;
  bit_array *pbVar3;
  bool bVar4;
  longdouble *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int variable;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  longdouble in_ST0;
  longdouble lVar12;
  longdouble in_ST1;
  longdouble lVar13;
  longdouble in_ST2;
  longdouble lVar14;
  longdouble lVar15;
  longdouble in_ST3;
  longdouble lVar16;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  
  lVar8 = (long)k * 0x10;
  lVar1 = *(longdouble *)(*(long *)(this + 0x78) + lVar8);
  plVar5 = (longdouble *)(*(long *)(this + 0x78) + lVar8);
  lVar14 = kappa / ((longdouble)1 - kappa) + delta;
  variable = (int)x;
  if (selected < 0) {
    *plVar5 = **(longdouble **)(this + 0x60) * (longdouble)0.5 + lVar1;
    if (r_size != 0) {
      lVar6 = 0;
      lVar18 = in_ST3;
      lVar19 = in_ST3;
      do {
        iVar2 = *(int *)(*(long *)(this + 0x60) + 0x10 + lVar6);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl - lVar14;
        lVar12 = lVar19;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if (in_ST0 <= (longdouble)0) {
          lVar7 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar7) =
               (*(longdouble *)(*(long *)(this + 0x50) + lVar7) + in_ST0) - lVar14;
        }
        lVar6 = lVar6 + 0x20;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = lVar18;
        lVar18 = lVar19;
        lVar19 = lVar12;
      } while ((ulong)(uint)r_size << 5 != lVar6);
    }
  }
  else {
    uVar10 = selected + 1;
    lVar18 = *(longdouble *)(*(long *)(this + 0x60) + (ulong)(uint)selected * 0x20);
    if ((int)uVar10 < r_size) {
      uVar9 = (ulong)uVar10 * 0x20;
      uVar11 = 0;
      *plVar5 = (*(longdouble *)(*(long *)(this + 0x60) + uVar9) + lVar18) * (longdouble)0.5 + lVar1
      ;
      lVar18 = in_ST3;
      lVar19 = in_ST3;
      do {
        lVar17 = lVar19;
        lVar16 = lVar18;
        lVar15 = in_ST3;
        lVar13 = in_ST2;
        lVar12 = in_ST1;
        iVar2 = *(int *)(*(long *)(this + 0x60) + 0x10 + uVar11);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             lVar14 + *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl;
        lVar19 = lVar17;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if ((longdouble)0 <= in_ST0) {
          lVar6 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar6) =
               lVar14 + (*(longdouble *)(*(long *)(this + 0x50) + lVar6) - in_ST0);
        }
        uVar11 = uVar11 + 0x20;
        in_ST0 = lVar12;
        in_ST1 = lVar13;
        in_ST2 = lVar15;
        in_ST3 = lVar16;
        lVar18 = lVar17;
      } while (uVar9 != uVar11);
      uVar9 = uVar9 | 0x10;
      lVar6 = (ulong)(uint)r_size - (ulong)uVar10;
      do {
        iVar2 = *(int *)(*(long *)(this + 0x60) + uVar9);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        pbVar3 = *(bit_array **)(this + 0x50);
        *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
             *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl - lVar14;
        lVar18 = lVar19;
        solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
        ::local_compute_reduced_cost<baryonyx::bit_array>
                  ((longdouble *)this,
                   (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                    *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
        if (lVar12 <= (longdouble)0) {
          lVar7 = (long)it[iVar2].value * 0x10;
          *(longdouble *)(*(long *)(this + 0x50) + lVar7) =
               (*(longdouble *)(*(long *)(this + 0x50) + lVar7) + lVar12) - lVar14;
        }
        uVar9 = uVar9 + 0x20;
        lVar6 = lVar6 + -1;
        lVar12 = lVar13;
        lVar13 = lVar15;
        lVar15 = lVar16;
        lVar16 = lVar17;
        lVar17 = lVar19;
        lVar19 = lVar18;
      } while (lVar6 != 0);
    }
    else {
      *plVar5 = lVar18 * (longdouble)1.5 + lVar1;
      if (r_size != 0) {
        lVar6 = 0;
        lVar18 = in_ST3;
        lVar19 = in_ST3;
        do {
          iVar2 = *(int *)(*(long *)(this + 0x60) + 0x10 + lVar6);
          bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
          pbVar3 = *(bit_array **)(this + 0x50);
          *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl =
               lVar14 + *(longdouble *)&pbVar3[it[iVar2].value].super_bit_array_impl;
          lVar12 = lVar19;
          solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
          ::local_compute_reduced_cost<baryonyx::bit_array>
                    ((longdouble *)this,
                     (solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                      *)(ulong)(uint)it[iVar2].column,variable,pbVar3);
          if ((longdouble)0 <= in_ST0) {
            lVar7 = (long)it[iVar2].value * 0x10;
            *(longdouble *)(*(long *)(this + 0x50) + lVar7) =
                 lVar14 + (*(longdouble *)(*(long *)(this + 0x50) + lVar7) - in_ST0);
          }
          lVar6 = lVar6 + 0x20;
          in_ST0 = in_ST1;
          in_ST1 = in_ST2;
          in_ST2 = in_ST3;
          in_ST3 = lVar18;
          lVar18 = lVar19;
          lVar19 = lVar12;
        } while ((ulong)(uint)r_size << 5 != lVar6);
      }
    }
  }
  bVar4 = is_valid_constraint<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::maximize_tag,baryonyx::itm::quadratic_cost_type<long_double>,false>,baryonyx::bit_array>
                    ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::quadratic_cost_type<long_double>,_false>
                      *)this,k,x);
  if (!bVar4) {
    local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>();
  }
  return (bool)((byte)((byte)((unkuint10)lVar1 >> 0x48) ^
                      (byte)((ushort)*(undefined2 *)(*(long *)(this + 0x78) + 8 + lVar8) >> 8)) >> 7
               );
}

Assistant:

bool local_affect(Xtype& x,
                      Iterator it,
                      int k,
                      int selected,
                      int r_size,
                      const Float kappa,
                      const Float delta)
    {
        constexpr Float one{ 1 };
        constexpr Float two{ 2 };
        constexpr Float middle{ (two + one) / two };

        const auto old_pi = pi[k];

        auto d = (kappa / (one - kappa)) + delta;

        if (selected < 0) {
            pi[k] += R[0].value / two;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[0].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        } else if (selected + 1 >= r_size) {
            pi[k] += R[selected].value * middle;

            logger::log("    selected: {}/{} ({})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        pi[k]);

            for (int i = 0; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }
        } else {
            pi[k] += ((R[selected].value + R[selected + 1].value) / two);

            logger::log("    selected: {}/{} ({}x{})/2 = pi {}\n",
                        selected,
                        r_size,
                        R[selected].value,
                        R[selected + 1].value,
                        pi[k]);

            int i = 0;
            for (; i <= selected; ++i) {
                auto var = it + R[i].id;

                x.set(var->column);
                P[var->value] += d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair >= 0)
                    P[var->value] = P[var->value] - repair + d;
            }

            for (; i != r_size; ++i) {
                auto var = it + R[i].id;

                x.unset(var->column);
                P[var->value] -= d;

                auto repair = local_compute_reduced_cost(var->column, x);
                if (repair <= 0)
                    P[var->value] = P[var->value] + repair - d;
            }
        }

        // TODO job: develops is_valid_constraint for all the solvers
        bx_expects(is_valid_constraint(*this, k, x));

        return is_signbit_change(old_pi, pi[k]);
    }